

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

EndsWith * __thiscall
Catch::Matchers::Impl::StdString::EndsWith::toString_abi_cxx11_(EndsWith *this)

{
  CasedString local_88;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  EndsWith *this_local;
  
  this_local = this;
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "ends with: \"");
  std::operator+(local_38,(char *)local_58);
  CasedString::toStringSuffix_abi_cxx11_(&local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,local_38)
  ;
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

virtual std::string toString() const {
                return "ends with: \"" + m_data.m_str + "\"" + m_data.toStringSuffix();
            }